

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_errors.hpp
# Opt level: O2

void Fossilize::log_error_pnext_chain(string *what,void *pNext)

{
  bool bVar1;
  long *in_FS_OFFSET;
  string local_40;
  
  std::__cxx11::string::append((char *)what);
  while ((int *)pNext != (int *)0x0) {
    std::__cxx11::to_string(&local_40,*pNext);
    std::__cxx11::string::append((string *)what);
    std::__cxx11::string::_M_dispose();
    pNext = *(void **)((long)pNext + 8);
    if ((int *)pNext != (int *)0x0) {
      std::__cxx11::string::append((char *)what);
    }
  }
  std::__cxx11::string::append((char *)what);
  if (*(int *)(*in_FS_OFFSET + -0x18) < 2) {
    bVar1 = Internal::log_thread_callback(LOG_DEFAULT,"%s\n",(what->_M_dataplus)._M_p);
    if (!bVar1) {
      fprintf(_stderr,"Fossilize WARN: %s\n",(what->_M_dataplus)._M_p);
    }
  }
  return;
}

Assistant:

static inline void log_error_pnext_chain(std::string what, const void *pNext)
{
	what += " (pNext->sType chain: [";
	while (pNext != nullptr)
	{
		auto *next = static_cast<const VkBaseInStructure *>(pNext);
		what += std::to_string(next->sType);
		pNext = next->pNext;
		if (pNext != nullptr)
			what += ", ";
	}
	what += "])";
	LOGW_LEVEL("%s\n", what.c_str());
}